

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

bool __thiscall
SVGChart::PPlot::DrawXTick
          (PPlot *this,float inX,int inScreenY,bool inMajor,string *inFormatString,
          Painter *inPainter,PRect *outRect)

{
  int iVar1;
  char *__format;
  undefined4 extraout_var;
  float extraout_XMM0_Da;
  int local_bc;
  float theScreenX;
  int theTickSize;
  char theBuf [128];
  PRect *outRect_local;
  Painter *inPainter_local;
  string *inFormatString_local;
  bool inMajor_local;
  int inScreenY_local;
  float inX_local;
  PPlot *this_local;
  
  theBuf._120_8_ = outRect;
  (*this->mXTrafo->_vptr_Trafo[2])((ulong)(uint)inX);
  *(long *)theBuf._120_8_ = (long)extraout_XMM0_Da;
  *(long *)(theBuf._120_8_ + 8) = (long)inScreenY;
  *(undefined8 *)(theBuf._120_8_ + 0x10) = 0;
  if (inMajor) {
    local_bc = (this->mXAxisSetup).mTickInfo.mMajorTickScreenSize;
    __format = (char *)std::__cxx11::string::c_str();
    snprintf((char *)&theScreenX,0x80,__format,(double)inX);
    iVar1 = (*inPainter->_vptr_Painter[9])();
    *(long *)(theBuf._120_8_ + 0x18) =
         CONCAT44(extraout_var,iVar1) + (long)local_bc +
         (long)(this->mXAxisSetup).mTickInfo.mMinorTickScreenSize;
    (*inPainter->_vptr_Painter[10])
              (inPainter,(ulong)(uint)(int)extraout_XMM0_Da,
               (ulong)(uint)(inScreenY + (int)*(undefined8 *)(theBuf._120_8_ + 0x18)),&theScreenX);
  }
  else {
    local_bc = (this->mXAxisSetup).mTickInfo.mMinorTickScreenSize;
    *(long *)(theBuf._120_8_ + 0x18) = (long)local_bc;
  }
  (**inPainter->_vptr_Painter)
            ((ulong)(uint)extraout_XMM0_Da,(float)inScreenY,extraout_XMM0_Da,
             (float)(inScreenY + local_bc));
  return true;
}

Assistant:

bool PPlot::DrawXTick (float inX, int inScreenY, bool inMajor, const string &inFormatString, Painter &inPainter, PRect &outRect) const{
      char theBuf[128];
      int theTickSize;
      float theScreenX = mXTrafo->Transform(inX);
      outRect.mX = theScreenX;
      outRect.mY = inScreenY;
      outRect.mW = 0;
      if (inMajor) {
        theTickSize = mXAxisSetup.mTickInfo.mMajorTickScreenSize;
        snprintf (theBuf, 128, inFormatString.c_str (), inX);

        outRect.mH = inPainter.GetFontHeight ()+theTickSize + mXAxisSetup.mTickInfo.mMinorTickScreenSize;;
        inPainter.DrawText (theScreenX, inScreenY+outRect.mH, theBuf);
      }
      else {
        theTickSize = mXAxisSetup.mTickInfo.mMinorTickScreenSize;
        outRect.mH = theTickSize;
      }

      inPainter.DrawLine (theScreenX, inScreenY,theScreenX, inScreenY+theTickSize);
      return true;
    }